

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O0

int av1_fast_palette_color_index_context(uint8_t *color_map,int stride,int r,int c,int *color_idx)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint8_t *in_RDI;
  uint *in_R8;
  int color_index_ctx;
  int idx_1;
  uint8_t color_index_ctx_hash;
  int idx;
  uint8_t current_color;
  uint8_t tmp_color_2;
  uint8_t tmp_score_2;
  uint8_t tmp_color_1;
  uint8_t tmp_score_1;
  uint8_t tmp_color;
  uint8_t tmp_score;
  uint8_t *score_rank;
  uint8_t *color_rank;
  uint8_t num_valid_colors;
  uint8_t num_invalid_colors;
  uint8_t scores [3];
  uint8_t color_neighbors [3];
  _Bool has_left;
  _Bool has_above;
  int local_5c;
  byte local_55;
  uint local_54;
  char local_31;
  byte local_30 [7];
  undefined1 local_29;
  int local_4;
  
  local_29 = -1 < in_EDX + -1;
  local_30[6] = -1 < in_ECX + -1;
  if (local_29 == local_30[6]) {
    uVar1 = in_RDI[in_EDX * in_ESI + in_ECX + -1];
    uVar2 = in_RDI[(in_EDX + -1) * in_ESI + in_ECX + -1];
    if (uVar1 == in_RDI[(in_EDX + -1) * in_ESI + in_ECX]) {
      local_31 = '\x01';
      if (uVar1 == uVar2) {
        local_31 = '\x02';
      }
    }
    else if (uVar1 == uVar2) {
      local_31 = '\x01';
    }
    else {
      local_31 = in_RDI[(in_EDX + -1) * in_ESI + in_ECX] == uVar2;
    }
    bVar3 = in_RDI[in_EDX * in_ESI + in_ECX];
    *in_R8 = (uint)bVar3;
    for (local_54 = 0; (int)local_54 < (int)(uint)(byte)(3U - local_31); local_54 = local_54 + 1) {
      if (bVar3 < local_30[(long)(int)local_54 + 3]) {
        *in_R8 = *in_R8 + 1;
      }
      else if (local_30[(long)(int)local_54 + 3] == bVar3) {
        *in_R8 = local_54;
        break;
      }
    }
    local_55 = 0;
    for (local_5c = 0; local_5c < (int)(uint)(byte)(3U - local_31); local_5c = local_5c + 1) {
      local_55 = local_55 + local_30[local_5c] * "\x01\x02\x02"[local_5c];
    }
    local_4 = 9 - (uint)local_55;
  }
  else {
    local_4 = av1_fast_palette_color_index_context_on_edge(in_RDI,in_ESI,in_EDX,in_ECX,(int *)in_R8)
    ;
  }
  return local_4;
}

Assistant:

static inline int av1_fast_palette_color_index_context(const uint8_t *color_map,
                                                       int stride, int r, int c,
                                                       int *color_idx) {
  assert(r > 0 || c > 0);

  const bool has_above = (r - 1 >= 0);
  const bool has_left = (c - 1 >= 0);
  assert(has_above || has_left);
  if (has_above ^ has_left) {
    return av1_fast_palette_color_index_context_on_edge(color_map, stride, r, c,
                                                        color_idx);
  }

  // This goes in the order of left, top, and top-left. This has the advantage
  // that unless anything here are not distinct or invalid, this will already
  // be in sorted order. Furthermore, if either of the first two is
  // invalid, we know the last one is also invalid.
  uint8_t color_neighbors[NUM_PALETTE_NEIGHBORS];
  color_neighbors[0] = color_map[(r - 0) * stride + (c - 1)];
  color_neighbors[1] = color_map[(r - 1) * stride + (c - 0)];
  color_neighbors[2] = color_map[(r - 1) * stride + (c - 1)];

  // Aggregate duplicated values.
  // Since our array is so small, using a couple if statements is faster
  uint8_t scores[NUM_PALETTE_NEIGHBORS] = { 2, 2, 1 };
  uint8_t num_invalid_colors = 0;
  if (color_neighbors[0] == color_neighbors[1]) {
    scores[0] += scores[1];
    color_neighbors[1] = INVALID_COLOR_IDX;
    num_invalid_colors += 1;

    if (color_neighbors[0] == color_neighbors[2]) {
      scores[0] += scores[2];
      num_invalid_colors += 1;
    }
  } else if (color_neighbors[0] == color_neighbors[2]) {
    scores[0] += scores[2];
    num_invalid_colors += 1;
  } else if (color_neighbors[1] == color_neighbors[2]) {
    scores[1] += scores[2];
    num_invalid_colors += 1;
  }

  const uint8_t num_valid_colors = NUM_PALETTE_NEIGHBORS - num_invalid_colors;

  uint8_t *color_rank = color_neighbors;
  uint8_t *score_rank = scores;

  // Sort everything
  if (num_valid_colors > 1) {
    if (color_neighbors[1] == INVALID_COLOR_IDX) {
      scores[1] = scores[2];
      color_neighbors[1] = color_neighbors[2];
    }

    // We need to swap the first two elements if they have the same score but
    // the color indices are not in the right order
    if (score_rank[0] < score_rank[1] ||
        (score_rank[0] == score_rank[1] && color_rank[0] > color_rank[1])) {
      SWAP(0, 1);
    }
    if (num_valid_colors > 2) {
      if (score_rank[0] < score_rank[2]) {
        SWAP(0, 2);
      }
      if (score_rank[1] < score_rank[2]) {
        SWAP(1, 2);
      }
    }
  }

  // If any of the neighbor colors has higher index than current color index,
  // then we move up by 1 unless the current color is the same as one of the
  // neighbors.
  const uint8_t current_color = *color_idx = color_map[r * stride + c];
  for (int idx = 0; idx < num_valid_colors; idx++) {
    if (color_rank[idx] > current_color) {
      (*color_idx)++;
    } else if (color_rank[idx] == current_color) {
      *color_idx = idx;
      break;
    }
  }

  // Get hash value of context.
  uint8_t color_index_ctx_hash = 0;
  static const uint8_t hash_multipliers[NUM_PALETTE_NEIGHBORS] = { 1, 2, 2 };
  for (int idx = 0; idx < num_valid_colors; ++idx) {
    color_index_ctx_hash += score_rank[idx] * hash_multipliers[idx];
  }
  assert(color_index_ctx_hash > 0);
  assert(color_index_ctx_hash <= MAX_COLOR_CONTEXT_HASH);

  // Lookup context from hash.
  const int color_index_ctx = 9 - color_index_ctx_hash;
  assert(color_index_ctx ==
         av1_palette_color_index_context_lookup[color_index_ctx_hash]);
  assert(color_index_ctx >= 0);
  assert(color_index_ctx < PALETTE_COLOR_INDEX_CONTEXTS);
  return color_index_ctx;
}